

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void help(void)

{
  puts("Usage: gbcc [options] file...");
  puts("Options:");
  puts("  --help           Display this information.");
  puts("  --version        Display compiler version information.");
  puts("  -E               Preprocess only; do not compile, assemble or link.");
  puts("  -S               Compile only; do not assemble or link.");
  puts("  -c               Compile and assemble, but do not link.");
  puts("  -o <file>        Place the output into <file>.");
  puts("  -g               Generate debug information file");
  puts("  -ftabstop=width  Set the distance between tab stops");
  exit(0);
}

Assistant:

void help()
{
    puts("Usage: gbcc [options] file...");
    puts("Options:");
    puts("  --help           Display this information.");
    puts("  --version        Display compiler version information.");
    puts("  -E               Preprocess only; do not compile, assemble or link.");
    puts("  -S               Compile only; do not assemble or link.");
    puts("  -c               Compile and assemble, but do not link.");
    puts("  -o <file>        Place the output into <file>.");
    puts("  -g               Generate debug information file");
    puts("  -ftabstop=width  Set the distance between tab stops");
    exit(EXIT_SUCCESS);
}